

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockNamedValue.cpp
# Opt level: O2

void __thiscall
MockNamedValueComparatorsAndCopiersRepository::clear
          (MockNamedValueComparatorsAndCopiersRepository *this)

{
  MockNamedValueComparatorsAndCopiersRepositoryNode *pMVar1;
  MockNamedValueComparatorsAndCopiersRepositoryNode *this_00;
  
  this_00 = this->head_;
  while (this_00 != (MockNamedValueComparatorsAndCopiersRepositoryNode *)0x0) {
    pMVar1 = this_00->next_;
    SimpleString::~SimpleString(&this_00->name_);
    operator_delete(this_00,0x28);
    this->head_ = pMVar1;
    this_00 = pMVar1;
  }
  return;
}

Assistant:

void MockNamedValueComparatorsAndCopiersRepository::clear()
{
    while (head_) {
        MockNamedValueComparatorsAndCopiersRepositoryNode* next = head_->next_;
        delete head_;
        head_ = next;
    }
}